

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_transaction_common.cpp
# Opt level: O2

void __thiscall
cfd::core::AbstractTransaction::RemoveScriptWitnessStackAll
          (AbstractTransaction *this,uint32_t tx_in_index)

{
  void *pvVar1;
  CfdException *this_00;
  undefined4 in_register_00000034;
  long lVar2;
  allocator local_45;
  int ret;
  undefined1 local_40 [32];
  
  (*this->_vptr_AbstractTransaction[0xb])
            (this,CONCAT44(in_register_00000034,tx_in_index),0x208,"RemoveScriptWitnessStackAll");
  pvVar1 = this->wally_tx_pointer_;
  if ((ulong)tx_in_index < *(ulong *)((long)pvVar1 + 0x10)) {
    lVar2 = (ulong)tx_in_index * 0xd0;
    if (*(long *)(*(long *)((long)pvVar1 + 8) + 0x38 + lVar2) != 0) {
      ret = wally_tx_witness_stack_free();
      *(undefined8 *)(*(long *)((long)pvVar1 + 8) + 0x38 + lVar2) = 0;
      if (ret != 0) {
        local_40._0_8_ = "cfdcore_transaction_common.cpp";
        local_40._8_4_ = 0x213;
        local_40._16_8_ = "RemoveScriptWitnessStackAll";
        logger::warn<int&>((CfdSourceLocation *)local_40,"wally_tx_witness_stack_free NG[{}].",&ret)
        ;
        this_00 = (CfdException *)__cxa_allocate_exception(0x30);
        ::std::__cxx11::string::string((string *)local_40,"witness stack error.",&local_45);
        CfdException::CfdException(this_00,kCfdIllegalStateError,(string *)local_40);
        __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
      }
    }
  }
  return;
}

Assistant:

void AbstractTransaction::RemoveScriptWitnessStackAll(uint32_t tx_in_index) {
  CheckTxInIndex(tx_in_index, __LINE__, __FUNCTION__);

  struct wally_tx *tx_pointer =
      static_cast<struct wally_tx *>(wally_tx_pointer_);
  if (tx_pointer->num_inputs > tx_in_index) {
    struct wally_tx_witness_stack *stack_pointer = NULL;
    if (tx_pointer->inputs[tx_in_index].witness != NULL) {
      stack_pointer = tx_pointer->inputs[tx_in_index].witness;
      int ret = wally_tx_witness_stack_free(stack_pointer);
      tx_pointer->inputs[tx_in_index].witness = NULL;
      if (ret != WALLY_OK) {
        warn(CFD_LOG_SOURCE, "wally_tx_witness_stack_free NG[{}].", ret);
        throw CfdException(kCfdIllegalStateError, "witness stack error.");
      }
    }
  }
}